

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O2

ON_SHA1_Hash * __thiscall ON_SHA1::Hash(ON_SHA1_Hash *__return_storage_ptr__,ON_SHA1 *this)

{
  uint uVar1;
  undefined8 uVar2;
  long lVar3;
  ON_SHA1 *pOVar4;
  ON_SHA1 *pOVar5;
  ON_SHA1 local_a0;
  
  uVar1 = this->m_status_bits;
  if ((uVar1 & 2) == 0) {
    pOVar4 = this;
    pOVar5 = &local_a0;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      pOVar5->m_byte_count = pOVar4->m_byte_count;
      pOVar4 = (ON_SHA1 *)&pOVar4->m_status_bits;
      pOVar5 = (ON_SHA1 *)&pOVar5->m_status_bits;
    }
    if ((uVar1 & 1) == 0) {
      local_a0.m_byte_count = 0;
      local_a0.m_bit_count[0] = 0;
      local_a0.m_bit_count[1] = 0;
      local_a0.m_state[0] = 0x67452301;
      local_a0.m_state[1] = 0xefcdab89;
      local_a0.m_state[2] = 0x98badcfe;
      local_a0.m_state[3] = 0x10325476;
      local_a0.m_state[4] = 0xc3d2e1f0;
      local_a0.m_status_bits = 1;
    }
    set_final_hash(&local_a0);
    *(undefined4 *)((this->m_sha1_hash).m_digest + 0x10) = local_a0.m_sha1_hash.m_digest._16_4_;
    *(undefined8 *)(this->m_sha1_hash).m_digest = local_a0.m_sha1_hash.m_digest._0_8_;
    *(undefined8 *)((this->m_sha1_hash).m_digest + 8) = local_a0.m_sha1_hash.m_digest._8_8_;
    this->m_status_bits = uVar1 | 2;
  }
  *(undefined4 *)(__return_storage_ptr__->m_digest + 0x10) =
       *(undefined4 *)((this->m_sha1_hash).m_digest + 0x10);
  uVar2 = *(undefined8 *)((this->m_sha1_hash).m_digest + 8);
  *(undefined8 *)__return_storage_ptr__->m_digest = *(undefined8 *)(this->m_sha1_hash).m_digest;
  *(undefined8 *)(__return_storage_ptr__->m_digest + 8) = uVar2;
  return __return_storage_ptr__;
}

Assistant:

ON_SHA1_Hash ON_SHA1::Hash() const
{
  if (2 != (2 & m_status_bits))
  {
    ON_SHA1 tmp(*this);
    if (1 != (1 & m_status_bits))
      tmp.Reset();
    tmp.set_final_hash();
    m_sha1_hash = tmp.m_sha1_hash;
    m_status_bits |= 2;
  }
  return m_sha1_hash;
}